

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool dumpKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *data)

{
  pointer psVar1;
  ostream *poVar2;
  stKeyPressData<short> *k;
  pointer psVar3;
  ofstream fout;
  
  std::ofstream::ofstream(&fout,(string *)fname,_S_out);
  psVar1 = (data->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (data->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    poVar2 = std::ostream::_M_insert<long>((long)&fout);
    poVar2 = std::operator<<(poVar2," 1");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return true;
}

Assistant:

bool dumpKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & data) {
    std::ofstream fout(fname);
    for (auto & k : data) {
        fout << k.pos << " 1" << std::endl;
    }
    fout.close();
    return true;
}